

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O0

TX_SIZE get_tx_size(int width,int height)

{
  TX_SIZE TVar1;
  int in_ESI;
  int in_EDI;
  
  if (in_EDI == in_ESI) {
    TVar1 = get_sqr_tx_size(in_EDI);
    return TVar1;
  }
  if (in_EDI < in_ESI) {
    if (in_EDI * 2 == in_ESI) {
      switch(in_EDI) {
      case 4:
        return '\x05';
      default:
        break;
      case 8:
        return '\a';
      case 0x10:
        return '\t';
      case 0x20:
        return '\v';
      }
    }
    else {
      if (in_EDI == 4) {
        return '\r';
      }
      if (in_EDI == 8) {
        return '\x0f';
      }
      if (in_EDI == 0x10) {
        return '\x11';
      }
    }
  }
  else if (in_ESI * 2 == in_EDI) {
    switch(in_ESI) {
    case 4:
      return '\x06';
    default:
      break;
    case 8:
      return '\b';
    case 0x10:
      return '\n';
    case 0x20:
      return '\f';
    }
  }
  else {
    if (in_ESI == 4) {
      return '\x0e';
    }
    if (in_ESI == 8) {
      return '\x10';
    }
    if (in_ESI == 0x10) {
      return '\x12';
    }
  }
  return '\0';
}

Assistant:

static inline TX_SIZE get_tx_size(int width, int height) {
  if (width == height) {
    return get_sqr_tx_size(width);
  }
  if (width < height) {
    if (width + width == height) {
      switch (width) {
        case 4: return TX_4X8; break;
        case 8: return TX_8X16; break;
        case 16: return TX_16X32; break;
        case 32: return TX_32X64; break;
      }
    } else {
      switch (width) {
        case 4: return TX_4X16; break;
        case 8: return TX_8X32; break;
        case 16: return TX_16X64; break;
      }
    }
  } else {
    if (height + height == width) {
      switch (height) {
        case 4: return TX_8X4; break;
        case 8: return TX_16X8; break;
        case 16: return TX_32X16; break;
        case 32: return TX_64X32; break;
      }
    } else {
      switch (height) {
        case 4: return TX_16X4; break;
        case 8: return TX_32X8; break;
        case 16: return TX_64X16; break;
      }
    }
  }
  assert(0);
  return TX_4X4;
}